

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeHex(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
             ArrayPtr<const_char> text)

{
  undefined4 uVar1;
  anon_unknown_0 aVar2;
  EncodingResult<kj::Array<unsigned_char>_> *pEVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  undefined4 unaff_R13D;
  Iterator __begin1;
  size_t sVar7;
  anon_unknown_0 local_6c [4];
  undefined4 local_68;
  undefined4 local_64;
  uchar *local_60;
  size_t local_58;
  EncodingResult<kj::Array<unsigned_char>_> *local_50;
  Array<unsigned_char> local_48;
  
  pcVar6 = text.ptr;
  local_58 = (ulong)pcVar6 >> 1;
  local_50 = __return_storage_ptr__;
  local_60 = _::HeapArrayDisposer::allocate<unsigned_char>(local_58);
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  for (sVar7 = 0; pEVar3 = local_50, local_58 != sVar7; sVar7 = sVar7 + 1) {
    anon_unknown_0::tryFromHexDigit(local_6c,(char)this[sVar7 * 2]);
    aVar2 = local_6c[0];
    if (local_6c[0] != (anon_unknown_0)0x0) {
      local_64 = local_68;
    }
    bVar4 = (char)local_64 << 4;
    if (local_6c[0] == (anon_unknown_0)0x0) {
      bVar4 = 0;
    }
    anon_unknown_0::tryFromHexDigit(local_6c,(char)this[sVar7 * 2 + 1]);
    pcVar6 = (char *)((ulong)pcVar6 & 0xff);
    if (((byte)aVar2 & 1) == 0) {
      pcVar6 = (char *)0x1;
    }
    uVar1 = local_68;
    if (local_6c[0] == (anon_unknown_0)0x0) {
      pcVar6 = (char *)0x1;
      uVar1 = unaff_R13D;
    }
    bVar5 = 0;
    if (local_6c[0] != (anon_unknown_0)0x0) {
      bVar5 = (byte)uVar1;
    }
    local_60[sVar7] = bVar5 | bVar4;
    unaff_R13D = uVar1;
  }
  (local_50->super_Array<unsigned_char>).ptr = local_60;
  (local_50->super_Array<unsigned_char>).size_ = local_58;
  (local_50->super_Array<unsigned_char>).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance
  ;
  local_48.ptr = (uchar *)0x0;
  local_48.size_ = 0;
  local_50->hadErrors = (bool)((byte)pcVar6 & 1);
  Array<unsigned_char>::~Array(&local_48);
  return pEVar3;
}

Assistant:

EncodingResult<Array<byte>> decodeHex(ArrayPtr<const char> text) {
  auto result = heapArray<byte>(text.size() / 2);
  bool hadErrors = text.size() % 2;

  for (auto i: kj::indices(result)) {
    byte b = 0;
    KJ_IF_MAYBE(d1, tryFromHexDigit(text[i*2])) {
      b = *d1 << 4;
    } else {
      hadErrors = true;
    }
    KJ_IF_MAYBE(d2, tryFromHexDigit(text[i*2+1])) {
      b |= *d2;
    } else {
      hadErrors = true;
    }